

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbufstream.h
# Opt level: O0

ssize_t __thiscall
StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::write
          (StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *this,int __fd,
          void *__buf,size_t __n)

{
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *pSVar1;
  ostream *poVar2;
  long lVar3;
  undefined4 in_register_00000034;
  streamsize nput;
  streamsize ntotal;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *self;
  uint local_4;
  
  pSVar1 = parent((ktxStream *)this);
  if ((__buf == (void *)0x0) || (__n == 0)) {
    local_4 = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)cnull,"\t write: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,__n);
    poVar2 = std::operator<<(poVar2,"*");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ulong)__buf);
    poVar2 = std::operator<<(poVar2,"B");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    lVar3 = std::streambuf::sputn((char *)pSVar1->_streambuf,CONCAT44(in_register_00000034,__fd));
    local_4 = 8;
    if (lVar3 == (long)__buf * __n) {
      local_4 = 0;
    }
  }
  return (ulong)local_4;
}

Assistant:

static KTX_error_code write(ktxStream* str, const void* src, ktx_size_t size, ktx_size_t count)
    {
        auto self = parent(str);
        if (size == 0 || count == 0)
        {
            return KTX_SUCCESS;
        }
        logstream << "\t write: " << count << "*" << size << "B" << std::endl;

        const auto ntotal = std::streamsize(size * count);
        const std::streamsize nput = self->_streambuf->sputn(reinterpret_cast<const char*>(src), ntotal);
        return (nput == ntotal) ? KTX_SUCCESS : KTX_FILE_WRITE_ERROR;
    }